

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<unsigned_short>(void)

{
  if (ConstCastTestT<unsigned_short>()::b == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::w == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::c == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::sc == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::uc == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::s == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::us == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::i == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::ui == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::l == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::ul == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::ll == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::ull == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::st == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::pt == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  if (ConstCastTestT<unsigned_short>()::pl == '\0') {
    ConstCastTestT<unsigned_short>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}